

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

int __thiscall application::run(application *this,int argc,char **argv)

{
  char **argv_00;
  int argc_00;
  char *pcVar1;
  typed_value<unsigned_short,_char> *ptVar2;
  size_type sVar3;
  pointer this_00;
  undefined1 local_218 [16];
  key_type local_208;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1e8;
  basic_parsed_options<char> local_1c0;
  variables_map local_198 [8];
  variables_map variables;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_188 [150];
  unsigned_short local_f2;
  object_type local_f0;
  allocator<char> local_d1;
  string local_d0 [32];
  options_description local_b0 [8];
  options_description options;
  unsigned_short local_2a;
  char **ppcStack_28;
  uint16_t port;
  char **argv_local;
  application *paStack_18;
  int argc_local;
  application *this_local;
  
  local_2a = 0;
  ppcStack_28 = argv;
  argv_local._4_4_ = argc;
  paStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"Options",&local_d1);
  boost::program_options::options_description::options_description
            (local_b0,local_d0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_f0.__align =
       (anon_struct_8_0_00000001_for___align)
       boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_f0.__data,"help");
  ptVar2 = boost::program_options::value<unsigned_short>(&local_2a);
  local_f2 = 0x2694;
  ptVar2 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar2,&local_f2);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)0x157780,(char *)ptVar2);
  boost::program_options::variables_map::variables_map(local_198);
  argc_00 = argv_local._4_4_;
  argv_00 = ppcStack_28;
  local_1e8.super_function_base.functor._8_8_ = 0;
  local_1e8.super_function_base.functor._16_8_ = 0;
  local_1e8.super_function_base.vtable = (vtable_base *)0x0;
  local_1e8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1e8);
  boost::program_options::parse_command_line<char>(&local_1c0,argc_00,argv_00,local_b0,0,&local_1e8)
  ;
  boost::program_options::store((basic_parsed_options *)&local_1c0,local_198,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1c0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1e8);
  boost::program_options::notify(local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"help",(allocator<char> *)(local_218 + 0xf));
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_188,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)(local_218 + 0xf));
  if (sVar3 == 0) {
    std::make_unique<cab_server,application&,boost::asio::io_context&,unsigned_short&>
              ((application *)local_218,(io_context *)this,(unsigned_short *)&this->_io_service);
    std::unique_ptr<cab_server,_std::default_delete<cab_server>_>::operator=
              (&this->_cab_server,
               (unique_ptr<cab_server,_std::default_delete<cab_server>_> *)local_218);
    std::unique_ptr<cab_server,_std::default_delete<cab_server>_>::~unique_ptr
              ((unique_ptr<cab_server,_std::default_delete<cab_server>_> *)local_218);
    this_00 = std::unique_ptr<cab_server,_std::default_delete<cab_server>_>::operator->
                        (&this->_cab_server);
    cab_server::run(this_00);
    boost::asio::io_context::run(&this->_io_service);
  }
  else {
    boost::program_options::operator<<((ostream *)&std::cout,local_b0);
  }
  this_local._4_4_ = 0;
  local_218._8_4_ = 1;
  boost::program_options::variables_map::~variables_map(local_198);
  boost::program_options::options_description::~options_description(local_b0);
  return this_local._4_4_;
}

Assistant:

int application::run(int argc, char** argv)
{
    std::uint16_t port = 0;

    boost::program_options::options_description options("Options");
    options.add_options()
        ("help", "shows this message")
        ("port", boost::program_options::value<std::uint16_t>(&port)->default_value(9876), "sets the cab server port");

    boost::program_options::variables_map variables;
    boost::program_options::store(boost::program_options::parse_command_line(argc, argv, options), variables);
    boost::program_options::notify(variables);

    if(variables.count("help"))
    {
        std::cout << options;
        return 0;
    }

    _cab_server = std::make_unique<cab_server>(*this, _io_service, port);

    _cab_server->run();
    _io_service.run();

    return 0;
}